

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall World::World(World *this)

{
  File_logger *this_00;
  Datetime_formatter *this_01;
  string local_90;
  string local_70;
  shared_ptr<util::logging::Formatter> local_50;
  allocator local_32;
  allocator local_31;
  
  this->_vptr_World = (_func_int **)&PTR__World_00121470;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pops).
  super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldpops).
  super__Vector_base<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>,_std::allocator<std::vector<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (File_logger *)operator_new(0x60);
  std::__cxx11::string::string((string *)&local_90,"genfunop.log",&local_32);
  this_01 = (Datetime_formatter *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_70,"%Y-%m-%dT%H:%M:%S%z",&local_31);
  util::logging::Datetime_formatter::Datetime_formatter(this_01,&local_70);
  boost::shared_ptr<util::logging::Formatter>::shared_ptr<util::logging::Datetime_formatter>
            (&local_50,this_01);
  util::logging::File_logger::File_logger(this_00,&local_90,&local_50,0x7f);
  boost::shared_ptr<util::logging::File_logger>::shared_ptr<util::logging::File_logger>
            (&this->LOGFILE,this_00);
  boost::detail::shared_count::~shared_count(&local_50.pn);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

World::World() :
	LOGFILE(new util::logging::File_logger())
{
}